

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStdIO.cpp
# Opt level: O0

bool Imf_3_2::anon_unknown_2::checkError(istream *is,streamsize expected)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ostream *poVar4;
  InputExc *this;
  long in_RSI;
  long *in_RDI;
  stringstream _iex_throw_s;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  long local_18;
  bool local_1;
  
  local_18 = in_RSI;
  uVar1 = std::ios::operator!((ios *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
  if ((uVar1 & 1) == 0) {
    local_1 = true;
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 != 0) {
      Iex_3_2::throwErrnoExc();
    }
    lVar3 = std::istream::gcount();
    if (lVar3 < local_18) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_1a0);
      poVar4 = std::operator<<(local_190,"Early end of file: read ");
      lVar3 = std::istream::gcount();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar3);
      poVar4 = std::operator<<(poVar4," out of ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_18);
      std::operator<<(poVar4," requested bytes.");
      this = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::InputExc::InputExc(this,local_1a0);
      __cxa_throw(this,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
checkError (istream& is, streamsize expected = 0)
{
    if (!is)
    {
        if (errno) IEX_NAMESPACE::throwErrnoExc ();

        if (is.gcount () < expected)
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "Early end of file: read " << is.gcount () << " out of "
                                           << expected << " requested bytes.");
        }
        return false;
    }

    return true;
}